

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

Gia_Man_t *
Gia_ManResub1(char *pFileName,int nNodes,int nSupp,int nDivs,int iChoice,int fUseXor,int fVerbose,
             int fVeryVerbose)

{
  Vec_Int_t *pVVar1;
  void *__ptr;
  bool bVar2;
  char cVar3;
  uint uVar4;
  FILE *__stream;
  Vec_Wrd_t *vSims;
  word *pwVar5;
  Vec_Ptr_t *vDivs;
  Gia_ResbMan_t *p;
  Vec_Wec_t *vFuncs;
  Vec_Int_t *p_00;
  Gia_Man_t *pGVar6;
  int iVar7;
  long lVar8;
  ulong Entry;
  long lVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    vSims = (Vec_Wrd_t *)0x0;
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
    iVar11 = 0;
    vDivs = (Vec_Ptr_t *)0x0;
LAB_007aa82d:
    p = Gia_ResbAlloc(iVar11);
    if (0x3fff < vDivs->nSize) {
      printf("Reducing all divs from %d to %d.\n",(ulong)(uint)vDivs->nSize,0x3fff);
      if (vDivs->nSize < 0x3fff) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
      }
      vDivs->nSize = 0x3fff;
    }
    Gia_ManResubPerform(p,vDivs,iVar11,100,0x32,iChoice,fUseXor,1,1);
    pVVar1 = p->vGates;
    iVar11 = pVVar1->nSize;
    if (iVar11 == 0) {
      puts("Decomposition did not succeed.");
      pGVar6 = (Gia_Man_t *)0x0;
    }
    else {
      vFuncs = (Vec_Wec_t *)malloc(0x10);
      vFuncs->nCap = 8;
      lVar8 = 8;
      p_00 = (Vec_Int_t *)calloc(8,0x10);
      vFuncs->pArray = p_00;
      vFuncs->nSize = 1;
      if (0 < iVar11) {
        lVar9 = 0;
        do {
          Vec_IntPush(p_00,pVVar1->pArray[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar1->nSize);
      }
      pGVar6 = Gia_ManConstructFromGates(vFuncs,vDivs->nSize);
      do {
        __ptr = *(void **)((long)&p_00->nCap + lVar8);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          *(undefined8 *)((long)&p_00->nCap + lVar8) = 0;
        }
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x88);
      free(p_00);
      free(vFuncs);
    }
    Gia_ResbFree(p);
    if (vDivs->pArray != (void **)0x0) {
      free(vDivs->pArray);
    }
    free(vDivs);
    if (vSims->pArray != (word *)0x0) {
      free(vSims->pArray);
    }
    free(vSims);
    return pGVar6;
  }
  vSims = (Vec_Wrd_t *)malloc(0x10);
  vSims->nCap = 1000;
  vSims->nSize = 0;
  pwVar5 = (word *)malloc(8000);
  vSims->pArray = pwVar5;
  iVar10 = 0;
  uVar12 = 0xffffffff;
  Entry = 0;
LAB_007aa70d:
  iVar11 = (int)uVar12;
LAB_007aa713:
  do {
    uVar4 = fgetc(__stream);
    if ((int)uVar4 < 0xd) goto LAB_007aa72c;
  } while ((uVar4 == 0xd) || (uVar4 == 0x20));
  goto LAB_007aa73f;
LAB_007aa72c:
  if (uVar4 == 9) goto LAB_007aa713;
  if (uVar4 == 0xffffffff) {
    iVar10 = vSims->nSize;
    if (iVar10 % iVar11 != 0) {
      __assert_fail("Vec_WrdSize(p) % nWords == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                    ,0x52c,"Vec_Wrd_t *Vec_WrdReadHex(char *, int *, int)");
    }
    fclose(__stream);
    printf("Read %d words of simulation data for %d objects.\n",uVar12,
           (long)iVar10 / (long)iVar11 & 0xffffffff);
    vDivs = Gia_ManDeriveDivs(vSims,iVar11);
    goto LAB_007aa82d;
  }
  if (uVar4 != 10) {
LAB_007aa73f:
    cVar3 = (char)uVar4;
    iVar7 = -0x30;
    if ((9 < (byte)(cVar3 - 0x30U)) &&
       ((iVar7 = -0x37, 5 < (byte)(cVar3 + 0xbfU) && (iVar7 = -0x57, 5 < (byte)(cVar3 + 0x9fU))))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                    ,0x506,"int Vec_WrdReadHexOne(char)");
    }
    Entry = (ulong)((uVar4 & 0xff) + iVar7) << ((char)iVar10 * '\x04' & 0x3fU) | Entry;
    bVar2 = 0xe < iVar10;
    iVar10 = iVar10 + 1;
    if (bVar2) {
      Vec_WrdPush(vSims,Entry);
      iVar10 = 0;
      Entry = 0;
    }
    goto LAB_007aa713;
  }
  if (0 < iVar10) {
    Vec_WrdPush(vSims,Entry);
    iVar10 = 0;
    Entry = 0;
  }
  if (iVar11 == -1) {
    uVar4 = vSims->nSize;
    if (vSims->nSize < 1) {
      uVar4 = 0xffffffff;
    }
    uVar12 = (ulong)uVar4;
  }
  goto LAB_007aa70d;
}

Assistant:

Gia_Man_t * Gia_ManResub1( char * pFileName, int nNodes, int nSupp, int nDivs, int iChoice, int fUseXor, int fVerbose, int fVeryVerbose )
{
    int nWords = 0;
    Gia_Man_t * pMan   = NULL;
    Vec_Wrd_t * vSims  = Vec_WrdReadHex( pFileName, &nWords, 1 );
    Vec_Ptr_t * vDivs  = vSims ? Gia_ManDeriveDivs( vSims, nWords ) : NULL;
    Gia_ResbMan_t * p = Gia_ResbAlloc( nWords );
    //Gia_ManCheckResub( vDivs, nWords );
    if ( Vec_PtrSize(vDivs) >= (1<<14) )
    {
        printf( "Reducing all divs from %d to %d.\n", Vec_PtrSize(vDivs), (1<<14)-1 );
        Vec_PtrShrink( vDivs, (1<<14)-1 );
    }
    assert( Vec_PtrSize(vDivs) < (1<<14) );
    Gia_ManResubPerform( p, vDivs, nWords, 100, 50, iChoice, fUseXor, 1, 1 );
    if ( Vec_IntSize(p->vGates) )
    {
        Vec_Wec_t * vGates = Vec_WecStart(1);
        Vec_IntAppend( Vec_WecEntry(vGates, 0), p->vGates );
        pMan = Gia_ManConstructFromGates( vGates, Vec_PtrSize(vDivs) );
        Vec_WecFree( vGates );
    }
    else
        printf( "Decomposition did not succeed.\n" );
    Gia_ResbFree( p );
    Vec_PtrFree( vDivs );
    Vec_WrdFree( vSims );
    return pMan;
}